

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O2

bool __thiscall
mpt::typed_array<mpt::reference<mpt::cycle>_>::insert
          (typed_array<mpt::reference<mpt::cycle>_> *this,long pos,reference<mpt::cycle> *val)

{
  content<mpt::reference<mpt::cycle>_> *pcVar1;
  bool bVar2;
  reference<mpt::cycle> *this_00;
  ulong uVar3;
  
  pcVar1 = (this->super_unique_array<mpt::reference<mpt::cycle>_>)._ref._ref;
  if (pcVar1 == (content<mpt::reference<mpt::cycle>_> *)0x0) {
    uVar3 = 0;
  }
  else {
    uVar3 = (pcVar1->super_buffer)._used >> 3;
  }
  if (pos < 0) {
    pos = pos + uVar3;
    if (pos < 0) {
      return false;
    }
  }
  else if (uVar3 <= (ulong)pos) {
    uVar3 = pos;
  }
  bVar2 = unique_array<mpt::reference<mpt::cycle>_>::reserve
                    (&this->super_unique_array<mpt::reference<mpt::cycle>_>,uVar3 + 1);
  if ((bVar2) &&
     (this_00 = (reference<mpt::cycle> *)
                content<mpt::reference<mpt::cycle>_>::insert
                          ((this->super_unique_array<mpt::reference<mpt::cycle>_>)._ref._ref,pos),
     this_00 != (reference<mpt::cycle> *)0x0)) {
    reference<mpt::cycle>::reference(this_00,val);
    return true;
  }
  return false;
}

Assistant:

bool insert(long pos, const T &val)
	{
		long len = this->length();
		if (pos < 0) {
			if ((pos += len) < 0) {
				return 0;
			}
		}
		else if (pos > len) {
			len = pos;
		}
		if (!this->reserve(len + 1)) {
			return 0;
		}
		void *d = this->_ref.instance()->insert(pos);
		if (d) {
			new (d) T(val);
			return true;
		}
		return false;
	}